

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O3

QPlatformMenu * __thiscall QMenuPrivate::createPlatformMenu(QMenuPrivate *this)

{
  long lVar1;
  QPlatformMenu *menu;
  Data *pDVar2;
  
  lVar1 = *(long *)&(this->super_QWidgetPrivate).field_0x8;
  pDVar2 = (this->platformMenu).wp.d;
  if (((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) ||
     ((this->platformMenu).wp.value == (QObject *)0x0)) {
    menu = (QPlatformMenu *)(**(code **)(*QGuiApplicationPrivate::platform_theme + 0x18))();
    setPlatformMenu(*(QMenuPrivate **)(lVar1 + 8),menu);
    syncPlatformMenu(*(QMenuPrivate **)(lVar1 + 8));
    pDVar2 = (this->platformMenu).wp.d;
    if (pDVar2 == (Data *)0x0) {
      return (QPlatformMenu *)0x0;
    }
  }
  if (*(int *)(pDVar2 + 4) == 0) {
    return (QPlatformMenu *)0x0;
  }
  return (QPlatformMenu *)(this->platformMenu).wp.value;
}

Assistant:

QPlatformMenu *QMenuPrivate::createPlatformMenu()
{
    Q_Q(QMenu);
    if (platformMenu.isNull())
        q->setPlatformMenu(QGuiApplicationPrivate::platformTheme()->createPlatformMenu());
    return platformMenu.data();
}